

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_uncompressed.cpp
# Opt level: O2

void duckdb::UncompressedStringStorage::StringFetchRow
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  int dict_offset;
  int iVar1;
  data_ptr_t pdVar2;
  uint32_t dict_end_offset;
  uint string_length;
  BufferHandle *this;
  data_ptr_t pdVar3;
  int iVar4;
  int val;
  string_t sVar5;
  
  this = ColumnFetchState::GetOrInsertHandle(state,segment);
  pdVar3 = BufferHandle::Ptr(this);
  pdVar3 = pdVar3 + segment->offset;
  dict_end_offset = GetDictionaryEnd(segment,this);
  pdVar2 = result->data;
  dict_offset = *(int *)(pdVar3 + row_id * 4 + 8);
  val = -dict_offset;
  if (0 < dict_offset) {
    val = dict_offset;
  }
  if (row_id != 0) {
    iVar1 = *(int *)(pdVar3 + row_id * 4 + 4);
    iVar4 = -iVar1;
    if (iVar1 < 1) {
      iVar4 = iVar1;
    }
    val = val + iVar4;
  }
  string_length = NumericCastImpl<unsigned_int,_int,_false>::Convert(val);
  sVar5 = FetchStringFromDict(segment,dict_end_offset,result,pdVar3,dict_offset,string_length);
  *(long *)(pdVar2 + result_idx * 0x10) = sVar5.value._0_8_;
  *(long *)(pdVar2 + result_idx * 0x10 + 8) = sVar5.value._8_8_;
  return;
}

Assistant:

void UncompressedStringStorage::StringFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id,
                                               Vector &result, idx_t result_idx) {
	// fetch a single row from the string segment
	// first pin the main buffer if it is not already pinned
	auto &handle = state.GetOrInsertHandle(segment);

	auto baseptr = handle.Ptr() + segment.GetBlockOffset();
	auto dict_end = GetDictionaryEnd(segment, handle);
	auto base_data = reinterpret_cast<int32_t *>(baseptr + DICTIONARY_HEADER_SIZE);
	auto result_data = FlatVector::GetData<string_t>(result);

	auto dict_offset = base_data[row_id];
	uint32_t string_length;
	if (DUCKDB_UNLIKELY(row_id == 0LL)) {
		// edge case where this is the first string in the dict
		string_length = NumericCast<uint32_t>(std::abs(dict_offset));
	} else {
		string_length = NumericCast<uint32_t>(std::abs(dict_offset) - std::abs(base_data[row_id - 1]));
	}
	result_data[result_idx] = FetchStringFromDict(segment, dict_end, result, baseptr, dict_offset, string_length);
}